

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O0

Status __thiscall HighsLpRelaxation::Playground::solveLp(Playground *this,HighsDomain *localdom)

{
  Status SVar1;
  Highs *in_RDI;
  bool in_stack_00000037;
  HighsDomain *in_stack_00000038;
  HighsLpRelaxation *in_stack_00000040;
  Highs *in_stack_00000058;
  undefined1 in_stack_00005827;
  HighsLpRelaxation *in_stack_00005828;
  
  if (((in_RDI->solution_).value_valid & 1U) == 0) {
    getLpSolver((HighsLpRelaxation *)in_RDI->_vptr_Highs);
    Highs::putIterate(in_RDI);
    flushDomain(in_stack_00000040,in_stack_00000038,in_stack_00000037);
    (in_RDI->solution_).value_valid = true;
  }
  else {
    flushDomain(in_stack_00000040,in_stack_00000038,in_stack_00000037);
    getLpSolver((HighsLpRelaxation *)in_RDI->_vptr_Highs);
    Highs::getIterate(in_stack_00000058);
  }
  SVar1 = run(in_stack_00005828,(bool)in_stack_00005827);
  return SVar1;
}

Assistant:

HighsLpRelaxation::Status solveLp(HighsDomain& localdom) {
      if (iterateStored) {
        lp->flushDomain(localdom);
        lp->getLpSolver().getIterate();
      } else {
        assert(lp->getLpSolver().getInfo().valid);
        lp->getLpSolver().putIterate();
        lp->flushDomain(localdom);
        iterateStored = true;
      }

      return lp->run(false);
    }